

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::anon_unknown_0::MinimizeRecGroups::getCanonicalPermutation
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MinimizeRecGroups *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> *this_00;
  __node_base_ptr *pp_Var1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_01;
  __node_base_ptr this_02;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  reference types_00;
  mapped_type *this_03;
  pointer ppVar10;
  type *this_04;
  iterator __first;
  iterator __last;
  reference ppVar11;
  reference pHVar12;
  reference pHVar13;
  mapped_type *__x;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar15;
  key_type local_3d8;
  HeapType type_2;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_4;
  size_type local_3a0;
  pair<const_wasm::HeapType,_unsigned_int> local_398;
  HeapType local_388;
  HeapType type_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_3;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInFinalOrder;
  type *members_1;
  type *shape_2;
  _Self local_318;
  iterator __end3;
  iterator __begin3;
  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *__range3;
  undefined1 local_2f8 [4];
  Index i_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> finalOrder;
  type *members;
  type *shape_1;
  _Self local_2b0;
  iterator __end2_2;
  iterator __begin2_2;
  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *__range2_2;
  size_type local_290;
  size_type classSize;
  undefined1 local_280;
  size_type local_278;
  pair<const_wasm::HeapType,_unsigned_int> local_270;
  HeapType local_260;
  HeapType type;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInLeastOrder;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *leastOrder;
  function<bool_(wasm::HeapType,_wasm::HeapType)> local_1f0;
  undefined1 local_1d0 [8];
  ComparableRecGroupShape shape;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *order;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *__range2;
  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  typeClasses;
  undefined1 local_150 [16];
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_140;
  const_iterator local_138;
  undefined1 local_130 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> children;
  key_type local_f8;
  value_type curr;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  seen;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> workList;
  Index i;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  dfsOrders;
  allocator<wasm::HeapType> local_6b;
  key_equal local_6a;
  hasher local_69;
  __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_68;
  __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_60;
  undefined1 local_58 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typeSet;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  MinimizeRecGroups *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *permutation;
  
  typeSet._M_h._M_single_bucket = (__node_base_ptr)types;
  local_60._M_current =
       (HeapType *)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(types);
  local_68._M_current =
       (HeapType *)
       std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  typeSet._M_h._M_single_bucket);
  std::allocator<wasm::HeapType>::allocator(&local_6b);
  std::
  unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
              *)local_58,local_60,local_68,0,&local_69,&local_6a,&local_6b);
  std::allocator<wasm::HeapType>::~allocator(&local_6b);
  sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     typeSet._M_h._M_single_bucket);
  this_00 = (allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> *)
            ((long)&workList.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::allocator(this_00);
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
            *)&i,sVar3,this_00);
  std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::~allocator
            ((allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> *)
             ((long)&workList.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  workList.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  while( true ) {
    uVar4 = (ulong)(uint)workList.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage;
    sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       typeSet._M_h._M_single_bucket);
    if (sVar3 <= uVar4) {
      std::
      map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
      ::map((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
             *)&__range2);
      __end2 = std::
               vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ::begin((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                        *)&i);
      order = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
              std::
              vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              ::end((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&i);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                         *)&order), bVar2) {
        types_00 = __gnu_cxx::
                   __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                   ::operator*(&__end2);
        leastOrder = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this;
        shape.less._M_invoker = (_Invoker_type)types_00;
        std::function<bool(wasm::HeapType,wasm::HeapType)>::
        function<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_1_,void>
                  ((function<bool(wasm::HeapType,wasm::HeapType)> *)&local_1f0,
                   (anon_class_8_1_8991fb9c *)&leastOrder);
        ComparableRecGroupShape::ComparableRecGroupShape
                  ((ComparableRecGroupShape *)local_1d0,types_00,&local_1f0);
        std::function<bool_(wasm::HeapType,_wasm::HeapType)>::~function(&local_1f0);
        this_03 = std::
                  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                  ::operator[]((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                                *)&__range2,(key_type *)local_1d0);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            shape.less._M_invoker,0);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(this_03,pvVar6);
        ComparableRecGroupShape::~ComparableRecGroupShape((ComparableRecGroupShape *)local_1d0);
        __gnu_cxx::
        __normal_iterator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
        ::operator++(&__end2);
      }
      indexInLeastOrder._M_h._M_single_bucket =
           (__node_base_ptr)
           std::
           map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
           ::begin((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                    *)&__range2);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                              *)&indexInLeastOrder._M_h._M_single_bucket);
      this_01 = (ppVar10->first).super_RecGroupShape.types;
      std::
      unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
      ::unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                       *)&__range2_1);
      __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_01);
      type.id = (uintptr_t)
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                 *)&type), bVar2) {
        pHVar13 = __gnu_cxx::
                  __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                  ::operator*(&__end2_1);
        local_260.id = pHVar13->id;
        local_278 = std::
                    unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                    ::size((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                            *)&__range2_1);
        std::pair<const_wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_long,_true>
                  (&local_270,&local_260,&local_278);
        pVar15 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::insert((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&__range2_1,&local_270);
        classSize = (size_type)
                    pVar15.first.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                    _M_cur;
        local_280 = pVar15.second;
        __gnu_cxx::
        __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
        ::operator++(&__end2_1);
      }
      __range2_2 = (map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                    *)std::
                      map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                      ::begin((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                               *)&__range2);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                              *)&__range2_2);
      local_290 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            (&ppVar10->second);
      __end2_2 = std::
                 map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                 ::begin((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                          *)&__range2);
      local_2b0._M_node =
           (_Base_ptr)
           std::
           map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
           ::end((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                  *)&__range2);
      while( true ) {
        bVar2 = std::operator!=(&__end2_2,&local_2b0);
        if (!bVar2) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f8);
          sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                             typeSet._M_h._M_single_bucket);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f8,sVar3);
          for (__range3._4_4_ = 0; __range3._4_4_ < local_290; __range3._4_4_ = __range3._4_4_ + 1)
          {
            __end3 = std::
                     map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                     ::begin((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                              *)&__range2);
            local_318._M_node =
                 (_Base_ptr)
                 std::
                 map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                 ::end((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                        *)&__range2);
            while (bVar2 = std::operator!=(&__end3,&local_318), bVar2) {
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                        ::operator*(&__end3);
              std::
              get<0ul,wasm::ComparableRecGroupShape_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                        (ppVar11);
              indexInFinalOrder._M_h._M_single_bucket =
                   (__node_base_ptr)
                   std::
                   get<1ul,wasm::ComparableRecGroupShape_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                             (ppVar11);
              pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  indexInFinalOrder._M_h._M_single_bucket,(ulong)__range3._4_4_);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f8,pvVar7
                        );
              std::
              _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              ::operator++(&__end3);
            }
          }
          std::
          unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
          ::unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&__range2_3);
          __end2_3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                               ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f8
                               );
          type_1.id = (uintptr_t)
                      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                 local_2f8);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_3,
                                    (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type_1), bVar2) {
            pHVar12 = __gnu_cxx::
                      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                      ::operator*(&__end2_3);
            local_388.id = pHVar12->id;
            local_3a0 = std::
                        unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                        ::size((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                                *)&__range2_3);
            std::pair<const_wasm::HeapType,_unsigned_int>::
            pair<wasm::HeapType_&,_unsigned_long,_true>(&local_398,&local_388,&local_3a0);
            std::
            unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
            ::insert((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                      *)&__range2_3,&local_398);
            __gnu_cxx::
            __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
            ::operator++(&__end2_3);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
          sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                             typeSet._M_h._M_single_bucket);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    (__return_storage_ptr__,sVar3);
          this_02 = typeSet._M_h._M_single_bucket;
          __end2_4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                               ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                typeSet._M_h._M_single_bucket);
          type_2.id = (uintptr_t)
                      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_02)
          ;
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_4,
                                    (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type_2), bVar2) {
            pHVar13 = __gnu_cxx::
                      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                      ::operator*(&__end2_4);
            local_3d8.id = pHVar13->id;
            __x = std::
                  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                  ::at((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                        *)&__range2_3,&local_3d8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (__return_storage_ptr__,__x);
            __gnu_cxx::
            __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
            ::operator++(&__end2_4);
          }
          std::
          unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
          ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                            *)&__range2_3);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2f8);
          std::
          unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
          ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                            *)&__range2_1);
          std::
          map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
          ::~map((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                  *)&__range2);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&i);
          std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                            *)local_58);
          return __return_storage_ptr__;
        }
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ::operator*(&__end2_2);
        std::
        get<0ul,wasm::ComparableRecGroupShape_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                  (ppVar11);
        this_04 = std::
                  get<1ul,wasm::ComparableRecGroupShape_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                            (ppVar11);
        sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(this_04);
        if (sVar3 != local_290) break;
        __first = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_04);
        __last = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_04);
        finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&__range2_1;
        std::
        sort<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>
                  ((__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                    )__first._M_current,
                   (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                    )__last._M_current,
                   (anon_class_8_1_a722a8fc)
                   finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_iterator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::operator++(&__end2_2);
      }
      __assert_fail("members.size() == classSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                    ,0x313,
                    "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
                   );
    }
    pvVar5 = std::
             vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ::operator[]((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                           *)&i,(ulong)(uint)workList.
                                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       typeSet._M_h._M_single_bucket);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve(pvVar5,sVar3);
    pp_Var1 = &seen._M_h._M_single_bucket;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        typeSet._M_h._M_single_bucket,
                        (ulong)(uint)workList.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1,pvVar6);
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&curr);
    while (bVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &seen._M_h._M_single_bucket), ((bVar2 ^ 0xffU) & 1) != 0) {
      pp_Var1 = &seen._M_h._M_single_bucket;
      pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
      local_f8.id = pvVar7->id;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::pop_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
      sVar8 = std::
              unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                       *)local_58,&local_f8);
      if (sVar8 != 0) {
        pVar14 = std::
                 unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                 ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                           *)&curr,&local_f8);
        children.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)pVar14.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pvVar5 = std::
                   vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   ::operator[]((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                 *)&i,(ulong)(uint)workList.
                                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                               );
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(pvVar5,&local_f8);
          HeapType::getReferencedHeapTypes
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_130,&local_f8)
          ;
          pp_Var1 = &seen._M_h._M_single_bucket;
          local_140._M_current =
               (HeapType *)
               std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pp_Var1);
          __gnu_cxx::
          __normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          ::__normal_iterator<wasm::HeapType*>
                    ((__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      *)&local_138,&local_140);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::rbegin
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)(local_150 + 8));
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::rend
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_150);
          typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
                       insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>,void>
                                 ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)pp_Var1,
                                  local_138,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                   *)(local_150 + 8),
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                                   *)local_150);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_130);
        }
      }
    }
    pvVar5 = std::
             vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ::operator[]((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                           *)&i,(ulong)(uint)workList.
                                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(pvVar5);
    sVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       typeSet._M_h._M_single_bucket);
    if (sVar3 != sVar9) break;
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                      *)&curr);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &seen._M_h._M_single_bucket);
    workList.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)workList.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
  }
  __assert_fail("dfsOrders[i].size() == types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                ,0x2ee,
                "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
               );
}

Assistant:

std::vector<Index>
  getCanonicalPermutation(const std::vector<HeapType>& types) {
    // The correctness of this part depends on some interesting properties of
    // strongly connected graphs with ordered, directed edges. A permutation of
    // the vertices in a graph is an isomorphism that produces an isomorphic
    // graph. An automorphism is an isomorphism of a structure onto itself, so
    // an automorphism of a graph is a permutation of the vertices that does not
    // change the label-independent properties of a graph. Permutations can be
    // described in terms of sets of cycles of elements.
    //
    // As an example, consider this strongly-connected recursion group:
    //
    //     (rec
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //     )
    //
    // This group has one nontrivial automorphism: ($a1 $a2) ($b1 $b2). Applying
    // this automorphism gives this recursion group:
    //
    //     (rec
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //     )
    //
    // We can verify that the permutation was an automorphism by checking that
    // the label-independent properties of these two rec groups are the same.
    // Indeed, when we write the adjacency matrices with ordered edges for the
    // two graphs, they both come out to this:
    //
    //     0: _ 0 1 _
    //     1: 0 _ _ 1
    //     2: 1 _ _ 0
    //     3: _ 1 0 _
    //
    // In addition to having the same adjacency matrix, the two recursion groups
    // have the same vertex colorings since all of their types have the same
    // top-level structure. Since the label-independent properties of the
    // recursion groups (i.e. all the properties except the intended type
    // identity at each index) are the same, the permutation that takes one
    // group to the other is an automorphism. These are precisely the
    // permutations that do not change a recursion group's shape, so would not
    // change type identity under WebAssembly's isorecursive type system. In
    // other words, automorphisms cannot help us resolve shape conflicts, so we
    // want to avoid generating them.
    //
    // Theorem 1: All cycles in an automorphism of a strongly-connected
    // recursion group are the same size.
    //
    //     Proof: By contradiction. Assume there are two cycles of different
    //     sizes. Because the group is strongly connected, there is a path from
    //     an element in the smaller of these cycles to an element in the
    //     larger. This path must contain an edge between two vertices in cycles
    //     of different sizes N and M such that N < M. Apply the automorphism N
    //     times. The source of this edge has been cycled back to its original
    //     index, but the destination is not yet back at its original index, so
    //     the edge's destination index is different from its original
    //     destination index and the permutation we applied was not an
    //     automorphism after all.
    //
    // Corollary 1.1: No nontrivial automorphism of an SCC may have a stationary
    // element, since either all the cycles have size 1 and the automorphism is
    // trivial or all the cycles have some other size and there are no
    // stationary elements.
    //
    // Corollary 1.2: No two distinct permutations of an SCC with the same first
    // element (e.g. both with some type $t as the first element) have the same
    // shape, since no nontrivial automorphism can keep the first element
    // stationary while mapping one permutation to the other.
    //
    // Find a canonical ordering of the types in this group. The ordering must
    // be independent of the initial order of the types. To do so, consider the
    // orderings given by visitation order on a tree search rooted at each type
    // in the group. Since the group is strongly connected, a tree search from
    // any of types will visit all types in the group, so it will generate a
    // total and deterministic ordering of the types in the group. We can
    // compare the shapes of each of these orderings to organize the root
    // types and their generated orderings into ordered equivalence classes.
    // These equivalence classes each correspond to a cycle in an automorphism
    // of the graph because their elements are vertices that can all occupy the
    // initial index of the graph without the graph structure changing. We can
    // choose an arbitrary ordering from the least equivalence class as a
    // canonical ordering because all orderings in that class describe the same
    // label-independent graph.
    //
    // Compute the orderings generated by DFS on each type.
    std::unordered_set<HeapType> typeSet(types.begin(), types.end());
    std::vector<std::vector<HeapType>> dfsOrders(types.size());
    for (Index i = 0; i < types.size(); ++i) {
      dfsOrders[i].reserve(types.size());
      std::vector<HeapType> workList;
      workList.push_back(types[i]);
      std::unordered_set<HeapType> seen;
      while (!workList.empty()) {
        auto curr = workList.back();
        workList.pop_back();
        if (!typeSet.count(curr)) {
          continue;
        }
        if (seen.insert(curr).second) {
          dfsOrders[i].push_back(curr);
          auto children = curr.getReferencedHeapTypes();
          workList.insert(workList.end(), children.rbegin(), children.rend());
        }
      }
      assert(dfsOrders[i].size() == types.size());
    }

    // Organize the orderings into equivalence classes, mapping equivalent
    // shapes to lists of automorphically equivalent root types.
    std::map<ComparableRecGroupShape, std::vector<HeapType>> typeClasses;
    for (const auto& order : dfsOrders) {
      ComparableRecGroupShape shape(order, [this](HeapType a, HeapType b) {
        return this->typeIndices.at(a) < this->typeIndices.at(b);
      });
      typeClasses[shape].push_back(order[0]);
    }

    // Choose the initial canonical ordering.
    const auto& leastOrder = typeClasses.begin()->first.types;

    // We want our canonical ordering to have the additional property that it
    // contains one type from each equivalence class before a second type of any
    // equivalence class. Since our utility for enumerating the topological
    // sorts of the canonical order keeps the initial element fixed as long as
    // possible before moving to the next one, by Corollary 1.2 and because
    // permutations that begin with types in different equivalence class cannot
    // have the same shape (otherwise those initial types would be in the same
    // equivalence class), this will maximize the number of distinct shapes the
    // utility emits before starting to emit permutations that have the same
    // shapes as previous permutations. Since all the type equivalence classes
    // are the same size by Theorem 1, we can assemble the final order by
    // striping across the equivalence classes. We determine the order of types
    // taken from each equivalence class by sorting them by order of appearance
    // in the least order, which ensures the final order remains independent of
    // the initial order.
    std::unordered_map<HeapType, Index> indexInLeastOrder;
    for (auto type : leastOrder) {
      indexInLeastOrder.insert({type, indexInLeastOrder.size()});
    }
    auto classSize = typeClasses.begin()->second.size();
    for (auto& [shape, members] : typeClasses) {
      assert(members.size() == classSize);
      std::sort(members.begin(), members.end(), [&](HeapType a, HeapType b) {
        return indexInLeastOrder.at(a) < indexInLeastOrder.at(b);
      });
    }
    std::vector<HeapType> finalOrder;
    finalOrder.reserve(types.size());
    for (Index i = 0; i < classSize; ++i) {
      for (auto& [shape, members] : typeClasses) {
        finalOrder.push_back(members[i]);
      }
    }

    // Now what we actually want is the permutation that takes us from the final
    // canonical order to the original order of the types.
    std::unordered_map<HeapType, Index> indexInFinalOrder;
    for (auto type : finalOrder) {
      indexInFinalOrder.insert({type, indexInFinalOrder.size()});
    }
    std::vector<Index> permutation;
    permutation.reserve(types.size());
    for (auto type : types) {
      permutation.push_back(indexInFinalOrder.at(type));
    }
    return permutation;
  }